

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

void MapOptHandler_skyrotate(FMapInfoParser *parse,level_info_t *info)

{
  FName local_24;
  FGLROptions *local_20;
  FGLROptions *opt;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  opt = (FGLROptions *)info;
  info_local = (level_info_t *)parse;
  FName::FName(&local_24,"gl_renderer");
  local_20 = level_info_t::GetOptData<FGLROptions>(info,&local_24,true);
  FMapInfoParser::ParseAssign((FMapInfoParser *)info_local);
  FScanner::MustGetFloat((FScanner *)info_local);
  (local_20->skyrotatevector).X = (float)(double)(info_local->NextSecretMap).Chars;
  if (*(int *)&(info_local->RedirectMapName).Chars == 2) {
    FScanner::MustGetStringName((FScanner *)info_local,",");
  }
  FScanner::MustGetFloat((FScanner *)info_local);
  (local_20->skyrotatevector).Y = (float)(double)(info_local->NextSecretMap).Chars;
  if (*(int *)&(info_local->RedirectMapName).Chars == 2) {
    FScanner::MustGetStringName((FScanner *)info_local,",");
  }
  FScanner::MustGetFloat((FScanner *)info_local);
  (local_20->skyrotatevector).Z = (float)(double)(info_local->NextSecretMap).Chars;
  TVector3<float>::MakeUnit(&local_20->skyrotatevector);
  return;
}

Assistant:

DEFINE_MAP_OPTION(skyrotate, false)
{
	FGLROptions *opt = info->GetOptData<FGLROptions>("gl_renderer");

	parse.ParseAssign();
	parse.sc.MustGetFloat();
	opt->skyrotatevector.X = (float)parse.sc.Float;
	if (parse.format_type == FMapInfoParser::FMT_New) parse.sc.MustGetStringName(","); 
	parse.sc.MustGetFloat();
	opt->skyrotatevector.Y = (float)parse.sc.Float;
	if (parse.format_type == FMapInfoParser::FMT_New) parse.sc.MustGetStringName(","); 
	parse.sc.MustGetFloat();
	opt->skyrotatevector.Z = (float)parse.sc.Float;
	opt->skyrotatevector.MakeUnit();
}